

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_chunk_header(png_structrp png_ptr,png_uint_32 chunk_name,png_uint_32 length)

{
  png_byte buf [8];
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->io_state = 0x22;
    buf[0] = (png_byte)(length >> 0x18);
    buf[1] = (png_byte)(length >> 0x10);
    buf[2] = (png_byte)(length >> 8);
    buf[3] = (png_byte)length;
    buf[4] = (png_byte)(chunk_name >> 0x18);
    buf[5] = (png_byte)(chunk_name >> 0x10);
    buf[6] = (png_byte)(chunk_name >> 8);
    buf[7] = (png_byte)chunk_name;
    png_write_data(png_ptr,buf,8);
    png_ptr->chunk_name = chunk_name;
    png_reset_crc(png_ptr);
    png_calculate_crc(png_ptr,buf + 4,4);
    png_ptr->io_state = 0x42;
  }
  return;
}

Assistant:

static void
png_write_chunk_header(png_structrp png_ptr, png_uint_32 chunk_name,
    png_uint_32 length)
{
   png_byte buf[8];

#if defined(PNG_DEBUG) && (PNG_DEBUG > 0)
   PNG_CSTRING_FROM_CHUNK(buf, chunk_name);
   png_debug2(0, "Writing %s chunk, length = %lu", buf, (unsigned long)length);
#endif

   if (png_ptr == NULL)
      return;

#ifdef PNG_IO_STATE_SUPPORTED
   /* Inform the I/O callback that the chunk header is being written.
    * PNG_IO_CHUNK_HDR requires a single I/O call.
    */
   png_ptr->io_state = PNG_IO_WRITING | PNG_IO_CHUNK_HDR;
#endif

   /* Write the length and the chunk name */
   png_save_uint_32(buf, length);
   png_save_uint_32(buf + 4, chunk_name);
   png_write_data(png_ptr, buf, 8);

   /* Put the chunk name into png_ptr->chunk_name */
   png_ptr->chunk_name = chunk_name;

   /* Reset the crc and run it over the chunk name */
   png_reset_crc(png_ptr);

   png_calculate_crc(png_ptr, buf + 4, 4);

#ifdef PNG_IO_STATE_SUPPORTED
   /* Inform the I/O callback that chunk data will (possibly) be written.
    * PNG_IO_CHUNK_DATA does NOT require a specific number of I/O calls.
    */
   png_ptr->io_state = PNG_IO_WRITING | PNG_IO_CHUNK_DATA;
#endif
}